

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryHeap.hpp
# Opt level: O3

void __thiscall
Lib::
BinaryHeap<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Binding,_Indexing::BindingComparator<Inferences::ALASCA::SuperpositionConf::Lhs>_>
::~BinaryHeap(BinaryHeap<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Binding,_Indexing::BindingComparator<Inferences::ALASCA::SuperpositionConf::Lhs>_>
              *this)

{
  uint uVar1;
  Binding *pBVar2;
  
  pBVar2 = this->_data;
  if (pBVar2 != (Binding *)0x0) {
    uVar1 = this->_capacity;
    if (uVar1 != 1) {
      if (uVar1 == 0) {
        *(undefined8 *)pBVar2 = GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = pBVar2;
        return;
      }
      if (uVar1 < 3) {
        *(undefined8 *)pBVar2 = GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = pBVar2;
        return;
      }
      if (uVar1 == 3) {
        *(undefined8 *)pBVar2 = GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = pBVar2;
        return;
      }
      if (uVar1 < 5) {
        *(undefined8 *)pBVar2 = GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = pBVar2;
        return;
      }
      operator_delete(pBVar2,0x10);
      return;
    }
    *(undefined8 *)pBVar2 = GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
    GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = pBVar2;
  }
  return;
}

Assistant:

~BinaryHeap()
  {
    if(_data) {
      T* ep=_data+_size;
      while(ep!=_data1) {
	(--ep)->~T();
      }
      DEALLOC_KNOWN(_data,_capacity*sizeof(T),"BinaryHeap::T");
    }
  }